

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::ParseLiteralNoAST
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,EncodedChar *input,
          EncodedChar *inputLim,CharCount *outBodyEncodedChars,CharCount *outTotalEncodedChars,
          CharCount *outBodyChars,CharCount *outTotalChars)

{
  ParseError *pPVar1;
  code *pcVar2;
  bool bVar3;
  CharCount CVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  RegexFlags local_39;
  CharCount *pCStack_38;
  RegexFlags dummyFlags;
  CharCount *outBodyChars_local;
  CharCount *outTotalEncodedChars_local;
  CharCount *outBodyEncodedChars_local;
  EncodedChar *inputLim_local;
  EncodedChar *input_local;
  Parser<UTF8EncodingPolicyBase<false>,_true> *this_local;
  
  pCStack_38 = outBodyChars;
  outBodyChars_local = outTotalEncodedChars;
  outTotalEncodedChars_local = outBodyEncodedChars;
  outBodyEncodedChars_local = (CharCount *)inputLim;
  inputLim_local = input;
  input_local = (EncodedChar *)this;
  if (input == (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb7c,"(input != 0)","input != 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (outBodyEncodedChars_local < inputLim_local) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb7d,"(inputLim >= input)","inputLim >= input");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  SetPosition(this,inputLim_local,(EncodedChar *)outBodyEncodedChars_local,true);
  PatternPass0(this);
  CVar4 = Chars<unsigned_char>::OSB(this->next,inputLim_local);
  *outTotalEncodedChars_local = CVar4;
  CVar4 = Pos(this);
  *pCStack_38 = CVar4;
  ECMust(this,'/',-0x7ff5fc0c);
  local_39 = NoRegexFlags;
  Options(this,&local_39);
  this->unicodeFlagPresent = (local_39 & UnicodeRegexFlag) == UnicodeRegexFlag;
  this->caseInsensitiveFlagPresent = (local_39 & IgnoreCaseRegexFlag) == IgnoreCaseRegexFlag;
  this->dotAllFlagPresent = (local_39 & DotAllRegexFlag) == DotAllRegexFlag;
  CVar4 = Chars<unsigned_char>::OSB(this->next,inputLim_local);
  *outBodyChars_local = CVar4;
  CVar4 = Pos(this);
  *outTotalChars = CVar4;
  if ((this->deferredIfNotUnicodeError != (ParseError *)0x0) &&
     ((this->unicodeFlagPresent & 1U) == 0)) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
    pPVar1 = this->deferredIfNotUnicodeError;
    *puVar6 = *(undefined8 *)pPVar1;
    puVar6[1] = *(undefined8 *)&pPVar1->encodedPos;
    __cxa_throw(puVar6,&ParseError::typeinfo,0);
  }
  if ((this->deferredIfUnicodeError != (ParseError *)0x0) && ((this->unicodeFlagPresent & 1U) != 0))
  {
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
    pPVar1 = this->deferredIfUnicodeError;
    *puVar6 = *(undefined8 *)pPVar1;
    puVar6[1] = *(undefined8 *)&pPVar1->encodedPos;
    __cxa_throw(puVar6,&ParseError::typeinfo,0);
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::ParseLiteralNoAST
        ( const EncodedChar* input
        , const EncodedChar* inputLim
        , CharCount& outBodyEncodedChars
        , CharCount& outTotalEncodedChars
        , CharCount& outBodyChars
        , CharCount& outTotalChars )
    {
        Assert(IsLiteral);
        Assert(input != 0);
        Assert(inputLim >= input); // *inputLim need not be 0 because of deferred parsing

        // Body, pass 0
        SetPosition(input, inputLim, true);
        PatternPass0();
        outBodyEncodedChars = Chars<EncodedChar>::OSB(next, input);
        outBodyChars = Pos();

        // Options
        ECMust('/', ERRnoSlash);
        RegexFlags dummyFlags = NoRegexFlags;
        Options(dummyFlags);
        this->unicodeFlagPresent = (dummyFlags & UnifiedRegex::UnicodeRegexFlag) == UnifiedRegex::UnicodeRegexFlag;
        this->caseInsensitiveFlagPresent = (dummyFlags & UnifiedRegex::IgnoreCaseRegexFlag) == UnifiedRegex::IgnoreCaseRegexFlag;
        this->dotAllFlagPresent = (dummyFlags & UnifiedRegex::DotAllRegexFlag) == UnifiedRegex::DotAllRegexFlag;
        outTotalEncodedChars = Chars<EncodedChar>::OSB(next, input);
        outTotalChars = Pos();

        // If this HR has been set, that means we have an earlier failure than the one caught above.
        if (this->deferredIfNotUnicodeError != nullptr && !this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfNotUnicodeError);
        }
        else if(this->deferredIfUnicodeError != nullptr && this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfUnicodeError);
        }
    }